

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O3

dict_undo_rec * __thiscall
CVmObjDict::alloc_undo_rec(CVmObjDict *this,dict_undo_action action,char *txt,size_t len)

{
  dict_undo_rec *pdVar1;
  size_t __size;
  
  __size = 0x1f;
  if (txt != (char *)0x0) {
    __size = len + 0x1f;
  }
  pdVar1 = (dict_undo_rec *)malloc(__size);
  pdVar1->action = action;
  if (txt != (char *)0x0) {
    memcpy(pdVar1->txt,txt,len);
  }
  pdVar1->len = len;
  pdVar1->obj = 0;
  pdVar1->prop = 0;
  return pdVar1;
}

Assistant:

dict_undo_rec *CVmObjDict::alloc_undo_rec(dict_undo_action action,
                                          const char *txt, size_t len)
{
    size_t alloc_size;
    dict_undo_rec *rec;
    
    /* 
     *   compute the allocation size - start with the structure size, and
     *   add in the length we need to store the string if one is present 
     */
    alloc_size = sizeof(dict_undo_rec) - 1;
    if (txt != 0)
        alloc_size += len;

    /* allocate the record */
    rec = (dict_undo_rec *)t3malloc(alloc_size);

    /* set the action */
    rec->action = action;

    /* if there's a word, copy the text */
    if (txt != 0)
        memcpy(rec->txt, txt, len);

    /* save the word length */
    rec->len = len;

    /* presume we won't store an object or property */
    rec->obj = VM_INVALID_OBJ;
    rec->prop = VM_INVALID_PROP;

    /* return the new record */
    return rec;
}